

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O2

void __thiscall icu_63::RuleBasedNumberFormat::initDefaultRuleSet(RuleBasedNumberFormat *this)

{
  UBool UVar1;
  NFRuleSet *pNVar2;
  NFRuleSet **ppNVar3;
  ConstChar16Ptr local_130;
  ConstChar16Ptr local_128;
  ConstChar16Ptr local_120;
  char16_t *local_118;
  char16_t *local_108;
  char16_t *local_f8;
  UnicodeString duration;
  UnicodeString ordinal;
  UnicodeString spellout;
  
  this->defaultRuleSet = (NFRuleSet *)0x0;
  if (this->fRuleSets != (NFRuleSet **)0x0) {
    local_120.p_ = L"%spellout-numbering";
    UnicodeString::UnicodeString(&spellout,'\x01',&local_120,-1);
    local_f8 = local_120.p_;
    local_128.p_ = L"%digits-ordinal";
    UnicodeString::UnicodeString(&ordinal,'\x01',&local_128,-1);
    local_108 = local_128.p_;
    local_130.p_ = L"%duration";
    UnicodeString::UnicodeString(&duration,'\x01',&local_130,-1);
    local_118 = local_130.p_;
    for (ppNVar3 = this->fRuleSets + -1; ppNVar3[1] != (NFRuleSet *)0x0; ppNVar3 = ppNVar3 + 1) {
      UVar1 = UnicodeString::operator==(&ppNVar3[1]->name,&spellout);
      if (((UVar1 != '\0') ||
          (UVar1 = UnicodeString::operator==(&ppNVar3[1]->name,&ordinal), UVar1 != '\0')) ||
         (UVar1 = UnicodeString::operator==(&ppNVar3[1]->name,&duration), UVar1 != '\0')) {
        pNVar2 = ppNVar3[1];
        goto LAB_002212bd;
      }
    }
    pNVar2 = *ppNVar3;
    this->defaultRuleSet = pNVar2;
    if (pNVar2->fIsPublic == '\0') {
      do {
        if (ppNVar3 == this->fRuleSets) goto LAB_002212c4;
        pNVar2 = ppNVar3[-1];
        ppNVar3 = ppNVar3 + -1;
      } while (pNVar2->fIsPublic == '\0');
LAB_002212bd:
      this->defaultRuleSet = pNVar2;
    }
LAB_002212c4:
    UnicodeString::~UnicodeString(&duration);
    UnicodeString::~UnicodeString(&ordinal);
    UnicodeString::~UnicodeString(&spellout);
  }
  return;
}

Assistant:

void 
RuleBasedNumberFormat::initDefaultRuleSet()
{
    defaultRuleSet = NULL;
    if (!fRuleSets) {
        return;
    }

    const UnicodeString spellout(UNICODE_STRING_SIMPLE("%spellout-numbering"));
    const UnicodeString ordinal(UNICODE_STRING_SIMPLE("%digits-ordinal"));
    const UnicodeString duration(UNICODE_STRING_SIMPLE("%duration"));

    NFRuleSet**p = &fRuleSets[0];
    while (*p) {
        if ((*p)->isNamed(spellout) || (*p)->isNamed(ordinal) || (*p)->isNamed(duration)) {
            defaultRuleSet = *p;
            return;
        } else {
            ++p;
        }
    }

    defaultRuleSet = *--p;
    if (!defaultRuleSet->isPublic()) {
        while (p != fRuleSets) {
            if ((*--p)->isPublic()) {
                defaultRuleSet = *p;
                break;
            }
        }
    }
}